

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *
wallet::CreateRecipients
          (vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
           *outputs,set<int,_std::less<int>,_std::allocator<int>_> *subtract_fee_outputs)

{
  bool bVar1;
  size_type sVar2;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *in_RDI;
  long in_FS_OFFSET;
  type *amount;
  type *destination;
  size_t i;
  vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients;
  CRecipient recipient;
  CRecipient *in_stack_fffffffffffffef8;
  value_type *in_stack_ffffffffffffff00;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  ulong local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
             in_stack_fffffffffffffef8);
  for (local_98 = 0;
      sVar2 = std::
              vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
              ::size((vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
                      *)in_stack_fffffffffffffef8), local_98 < sVar2; local_98 = local_98 + 1) {
    std::
    vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
    ::at((vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
          *)in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00);
    std::
    get<0ul,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>,long>
              ((pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>
                *)in_stack_fffffffffffffef8);
    std::
    get<1ul,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>,long>
              ((pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>
                *)in_stack_fffffffffffffef8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::variant(&in_stack_fffffffffffffef8->dest,
              (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               *)0x5585a4);
    in_stack_ffffffffffffff08 =
         (set<int,_std::less<int>,_std::allocator<int>_> *)&stack0xfffffffffffffff0;
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::contains
                      (in_stack_ffffffffffffff08,(key_type_conflict1 *)in_stack_ffffffffffffff00);
    *(bool *)&(in_stack_ffffffffffffff08->_M_t)._M_impl = bVar1;
    std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::push_back
              ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    CRecipient::~CRecipient(in_stack_fffffffffffffef8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<CRecipient> CreateRecipients(const std::vector<std::pair<CTxDestination, CAmount>>& outputs, const std::set<int>& subtract_fee_outputs)
{
    std::vector<CRecipient> recipients;
    for (size_t i = 0; i < outputs.size(); ++i) {
        const auto& [destination, amount] = outputs.at(i);
        CRecipient recipient{destination, amount, subtract_fee_outputs.contains(i)};
        recipients.push_back(recipient);
    }
    return recipients;
}